

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator_type.cpp
# Opt level: O3

string * __thiscall
duckdb::PhysicalOperatorToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,PhysicalOperatorType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "ORDER_BY";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "LIMIT";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "STREAMING_LIMIT";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "LIMIT_PERCENT";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "TOP_N";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "WINDOW";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "UNNEST";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "UNGROUPED_AGGREGATE";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "HASH_GROUP_BY";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "PERFECT_HASH_GROUP_BY";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "PARTITIONED_AGGREGATE";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "FILTER";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "PROJECTION";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "COPY_TO_FILE";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "BATCH_COPY_TO_FILE";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "RESERVOIR_SAMPLE";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "STREAMING_SAMPLE";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "STREAMING_WINDOW";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "PIVOT";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "COPY_DATABASE";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "TABLE_SCAN";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "DUMMY_SCAN";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "COLUMN_DATA_SCAN";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "CHUNK_SCAN";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "REC_CTE_SCAN";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "REC_REC_CTE_SCAN";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "CTE_SCAN";
    pcVar1 = "";
    break;
  case 0x1c:
    pcVar2 = "DELIM_SCAN";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "EXPRESSION_SCAN";
    pcVar1 = "";
    break;
  case 0x1e:
    pcVar2 = "POSITIONAL_SCAN";
    pcVar1 = "";
    break;
  case 0x1f:
    pcVar2 = "BLOCKWISE_NL_JOIN";
    pcVar1 = "";
    break;
  case 0x20:
    pcVar2 = "NESTED_LOOP_JOIN";
    pcVar1 = "";
    break;
  case 0x21:
    pcVar2 = "HASH_JOIN";
    pcVar1 = "";
    break;
  case 0x22:
    pcVar2 = "CROSS_PRODUCT";
    pcVar1 = "";
    break;
  case 0x23:
    pcVar2 = "PIECEWISE_MERGE_JOIN";
    pcVar1 = "";
    break;
  case 0x24:
    pcVar2 = "IE_JOIN";
    pcVar1 = "";
    break;
  case 0x25:
    pcVar2 = "LEFT_DELIM_JOIN";
    pcVar1 = "";
    break;
  case 0x26:
    pcVar2 = "RIGHT_DELIM_JOIN";
    pcVar1 = "";
    break;
  case 0x27:
    pcVar2 = "POSITIONAL_JOIN";
    pcVar1 = "";
    break;
  case 0x28:
    pcVar2 = "ASOF_JOIN";
    pcVar1 = "";
    break;
  case 0x29:
    pcVar2 = "UNION";
    pcVar1 = "";
    break;
  case 0x2a:
    pcVar2 = "REC_CTE";
    pcVar1 = "";
    break;
  case 0x2b:
    pcVar2 = "REC_KEY_CTE";
    pcVar1 = "";
    break;
  case 0x2c:
    pcVar2 = "CTE";
    pcVar1 = "";
    break;
  case 0x2d:
    pcVar2 = "INSERT";
    pcVar1 = "";
    break;
  case 0x2e:
    pcVar2 = "BATCH_INSERT";
    pcVar1 = "";
    break;
  case 0x2f:
    pcVar2 = "DELETE";
    pcVar1 = "";
    break;
  case 0x30:
    pcVar2 = "UPDATE";
    pcVar1 = "";
    break;
  case 0x31:
    pcVar2 = "CREATE_TABLE";
    pcVar1 = "";
    break;
  case 0x32:
    pcVar2 = "CREATE_TABLE_AS";
    pcVar1 = "";
    break;
  case 0x33:
    pcVar2 = "BATCH_CREATE_TABLE_AS";
    pcVar1 = "";
    break;
  case 0x34:
    pcVar2 = "CREATE_INDEX";
    pcVar1 = "";
    break;
  case 0x35:
    pcVar2 = "ALTER";
    pcVar1 = "";
    break;
  case 0x36:
    pcVar2 = "CREATE_SEQUENCE";
    pcVar1 = "";
    break;
  case 0x37:
    pcVar2 = "CREATE_VIEW";
    pcVar1 = "";
    break;
  case 0x38:
    pcVar2 = "CREATE_SCHEMA";
    pcVar1 = "";
    break;
  case 0x39:
    pcVar2 = "CREATE_MACRO";
    pcVar1 = "";
    break;
  case 0x3a:
    pcVar2 = "DROP";
    pcVar1 = "";
    break;
  case 0x3b:
    pcVar2 = "PRAGMA";
    pcVar1 = "";
    break;
  case 0x3c:
    pcVar2 = "TRANSACTION";
    pcVar1 = "";
    break;
  case 0x3d:
    pcVar2 = "CREATE_TYPE";
    pcVar1 = "";
    break;
  case 0x3e:
    pcVar2 = "ATTACH";
    pcVar1 = "";
    break;
  case 0x3f:
    pcVar2 = "DETACH";
    pcVar1 = "";
    break;
  case 0x40:
    pcVar2 = "EXPLAIN";
    pcVar1 = "";
    break;
  case 0x41:
    pcVar2 = "EXPLAIN_ANALYZE";
    pcVar1 = "";
    break;
  case 0x42:
    pcVar2 = "EMPTY_RESULT";
    pcVar1 = "";
    break;
  case 0x43:
    pcVar2 = "EXECUTE";
    pcVar1 = "";
    break;
  case 0x44:
    pcVar2 = "PREPARE";
    pcVar1 = "";
    break;
  case 0x45:
    pcVar2 = "VACUUM";
    pcVar1 = "";
    break;
  case 0x46:
    pcVar2 = "EXPORT";
    pcVar1 = "";
    break;
  case 0x47:
    pcVar2 = "SET";
    pcVar1 = "";
    break;
  case 0x48:
    pcVar2 = "SET_VARIABLE";
    pcVar1 = "";
    break;
  case 0x49:
    pcVar2 = "LOAD";
    pcVar1 = "";
    break;
  case 0x4a:
    pcVar2 = "INOUT_FUNCTION";
    pcVar1 = "";
    break;
  case 0x4b:
    pcVar2 = "RESULT_COLLECTOR";
    pcVar1 = "";
    break;
  case 0x4c:
    pcVar2 = "RESET";
    pcVar1 = "";
    break;
  case 0x4d:
    pcVar2 = "EXTENSION";
    pcVar1 = "";
    break;
  case 0x4e:
    pcVar2 = "VERIFY_VECTOR";
    pcVar1 = "";
    break;
  case 0x4f:
    pcVar2 = "UPDATE_EXTENSIONS";
    pcVar1 = "";
    break;
  case 0x50:
    pcVar2 = "CREATE_SECRET";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "INVALID";
    pcVar1 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string PhysicalOperatorToString(PhysicalOperatorType type) {
	switch (type) {
	case PhysicalOperatorType::TABLE_SCAN:
		return "TABLE_SCAN";
	case PhysicalOperatorType::DUMMY_SCAN:
		return "DUMMY_SCAN";
	case PhysicalOperatorType::CHUNK_SCAN:
		return "CHUNK_SCAN";
	case PhysicalOperatorType::COLUMN_DATA_SCAN:
		return "COLUMN_DATA_SCAN";
	case PhysicalOperatorType::DELIM_SCAN:
		return "DELIM_SCAN";
	case PhysicalOperatorType::ORDER_BY:
		return "ORDER_BY";
	case PhysicalOperatorType::LIMIT:
		return "LIMIT";
	case PhysicalOperatorType::LIMIT_PERCENT:
		return "LIMIT_PERCENT";
	case PhysicalOperatorType::STREAMING_LIMIT:
		return "STREAMING_LIMIT";
	case PhysicalOperatorType::RESERVOIR_SAMPLE:
		return "RESERVOIR_SAMPLE";
	case PhysicalOperatorType::STREAMING_SAMPLE:
		return "STREAMING_SAMPLE";
	case PhysicalOperatorType::TOP_N:
		return "TOP_N";
	case PhysicalOperatorType::WINDOW:
		return "WINDOW";
	case PhysicalOperatorType::STREAMING_WINDOW:
		return "STREAMING_WINDOW";
	case PhysicalOperatorType::UNNEST:
		return "UNNEST";
	case PhysicalOperatorType::UNGROUPED_AGGREGATE:
		return "UNGROUPED_AGGREGATE";
	case PhysicalOperatorType::HASH_GROUP_BY:
		return "HASH_GROUP_BY";
	case PhysicalOperatorType::PERFECT_HASH_GROUP_BY:
		return "PERFECT_HASH_GROUP_BY";
	case PhysicalOperatorType::PARTITIONED_AGGREGATE:
		return "PARTITIONED_AGGREGATE";
	case PhysicalOperatorType::FILTER:
		return "FILTER";
	case PhysicalOperatorType::PROJECTION:
		return "PROJECTION";
	case PhysicalOperatorType::COPY_TO_FILE:
		return "COPY_TO_FILE";
	case PhysicalOperatorType::BATCH_COPY_TO_FILE:
		return "BATCH_COPY_TO_FILE";
	case PhysicalOperatorType::LEFT_DELIM_JOIN:
		return "LEFT_DELIM_JOIN";
	case PhysicalOperatorType::RIGHT_DELIM_JOIN:
		return "RIGHT_DELIM_JOIN";
	case PhysicalOperatorType::BLOCKWISE_NL_JOIN:
		return "BLOCKWISE_NL_JOIN";
	case PhysicalOperatorType::NESTED_LOOP_JOIN:
		return "NESTED_LOOP_JOIN";
	case PhysicalOperatorType::HASH_JOIN:
		return "HASH_JOIN";
	case PhysicalOperatorType::PIECEWISE_MERGE_JOIN:
		return "PIECEWISE_MERGE_JOIN";
	case PhysicalOperatorType::IE_JOIN:
		return "IE_JOIN";
	case PhysicalOperatorType::ASOF_JOIN:
		return "ASOF_JOIN";
	case PhysicalOperatorType::CROSS_PRODUCT:
		return "CROSS_PRODUCT";
	case PhysicalOperatorType::POSITIONAL_JOIN:
		return "POSITIONAL_JOIN";
	case PhysicalOperatorType::POSITIONAL_SCAN:
		return "POSITIONAL_SCAN";
	case PhysicalOperatorType::UNION:
		return "UNION";
	case PhysicalOperatorType::INSERT:
		return "INSERT";
	case PhysicalOperatorType::BATCH_INSERT:
		return "BATCH_INSERT";
	case PhysicalOperatorType::DELETE_OPERATOR:
		return "DELETE";
	case PhysicalOperatorType::UPDATE:
		return "UPDATE";
	case PhysicalOperatorType::EMPTY_RESULT:
		return "EMPTY_RESULT";
	case PhysicalOperatorType::CREATE_TABLE:
		return "CREATE_TABLE";
	case PhysicalOperatorType::CREATE_TABLE_AS:
		return "CREATE_TABLE_AS";
	case PhysicalOperatorType::BATCH_CREATE_TABLE_AS:
		return "BATCH_CREATE_TABLE_AS";
	case PhysicalOperatorType::CREATE_INDEX:
		return "CREATE_INDEX";
	case PhysicalOperatorType::EXPLAIN:
		return "EXPLAIN";
	case PhysicalOperatorType::EXPLAIN_ANALYZE:
		return "EXPLAIN_ANALYZE";
	case PhysicalOperatorType::EXECUTE:
		return "EXECUTE";
	case PhysicalOperatorType::VACUUM:
		return "VACUUM";
	case PhysicalOperatorType::RECURSIVE_CTE:
		return "REC_CTE";
	case PhysicalOperatorType::RECURSIVE_KEY_CTE:
		return "REC_KEY_CTE";
	case PhysicalOperatorType::CTE:
		return "CTE";
	case PhysicalOperatorType::RECURSIVE_CTE_SCAN:
		return "REC_CTE_SCAN";
	case PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN:
		return "REC_REC_CTE_SCAN";
	case PhysicalOperatorType::CTE_SCAN:
		return "CTE_SCAN";
	case PhysicalOperatorType::EXPRESSION_SCAN:
		return "EXPRESSION_SCAN";
	case PhysicalOperatorType::ALTER:
		return "ALTER";
	case PhysicalOperatorType::CREATE_SEQUENCE:
		return "CREATE_SEQUENCE";
	case PhysicalOperatorType::CREATE_VIEW:
		return "CREATE_VIEW";
	case PhysicalOperatorType::CREATE_SCHEMA:
		return "CREATE_SCHEMA";
	case PhysicalOperatorType::CREATE_MACRO:
		return "CREATE_MACRO";
	case PhysicalOperatorType::CREATE_SECRET:
		return "CREATE_SECRET";
	case PhysicalOperatorType::DROP:
		return "DROP";
	case PhysicalOperatorType::PRAGMA:
		return "PRAGMA";
	case PhysicalOperatorType::TRANSACTION:
		return "TRANSACTION";
	case PhysicalOperatorType::PREPARE:
		return "PREPARE";
	case PhysicalOperatorType::EXPORT:
		return "EXPORT";
	case PhysicalOperatorType::SET:
		return "SET";
	case PhysicalOperatorType::SET_VARIABLE:
		return "SET_VARIABLE";
	case PhysicalOperatorType::RESET:
		return "RESET";
	case PhysicalOperatorType::LOAD:
		return "LOAD";
	case PhysicalOperatorType::INOUT_FUNCTION:
		return "INOUT_FUNCTION";
	case PhysicalOperatorType::CREATE_TYPE:
		return "CREATE_TYPE";
	case PhysicalOperatorType::ATTACH:
		return "ATTACH";
	case PhysicalOperatorType::DETACH:
		return "DETACH";
	case PhysicalOperatorType::RESULT_COLLECTOR:
		return "RESULT_COLLECTOR";
	case PhysicalOperatorType::EXTENSION:
		return "EXTENSION";
	case PhysicalOperatorType::PIVOT:
		return "PIVOT";
	case PhysicalOperatorType::COPY_DATABASE:
		return "COPY_DATABASE";
	case PhysicalOperatorType::VERIFY_VECTOR:
		return "VERIFY_VECTOR";
	case PhysicalOperatorType::UPDATE_EXTENSIONS:
		return "UPDATE_EXTENSIONS";
	case PhysicalOperatorType::INVALID:
		break;
	}
	return "INVALID";
}